

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O2

char * Diligent::Parsing::SkipDelimiters<char_const*>(char **Start,char **End,char *Delimiters)

{
  byte *pbVar1;
  char *pcVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar3 = (byte *)*Start;
  pbVar1 = (byte *)*End;
  if (Delimiters == (char *)0x0) {
    while (((pbVar4 = pbVar1, pbVar3 != pbVar1 && (pbVar4 = pbVar3, (ulong)*pbVar3 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
    }
  }
  else {
    while ((pbVar4 = pbVar1, pbVar3 != pbVar1 &&
           (pcVar2 = strchr(Delimiters,(int)(char)*pbVar3), pbVar4 = pbVar3, pcVar2 != (char *)0x0))
          ) {
      pbVar3 = pbVar3 + 1;
    }
  }
  return (char *)pbVar4;
}

Assistant:

InteratorType SkipDelimiters(const InteratorType& Start, const InteratorType& End, const char* Delimiters = nullptr) noexcept
{
    auto Pos = Start;
    if (Delimiters != nullptr)
    {
        while (Pos != End && strchr(Delimiters, *Pos))
            ++Pos;
    }
    else
    {
        while (Pos != End && IsDelimiter(*Pos))
            ++Pos;
    }
    return Pos;
}